

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall bloaty::RollupOutput::Print(RollupOutput *this,OutputOptions *options,ostream *out)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  ostream *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  long in_RDI;
  ostream *in_stack_000000e0;
  OutputOptions *in_stack_000000e8;
  RollupOutput *in_stack_000000f0;
  bool in_stack_000001f6;
  bool in_stack_000001f7;
  ostream *in_stack_000001f8;
  RollupOutput *in_stack_00000200;
  
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_RSI);
  if (!bVar2) {
    iVar1 = *(int *)&(in_RSI->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
    if (iVar1 == 0) {
      PrettyPrint(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
    }
    else if (iVar1 == 1) {
      PrintToCSV(in_stack_00000200,in_stack_000001f8,in_stack_000001f7,in_stack_000001f6);
    }
    else {
      if (iVar1 != 2) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc"
                      ,0x2bf,
                      "void bloaty::RollupOutput::Print(const OutputOptions &, std::ostream *)");
      }
      PrintToCSV(in_stack_00000200,in_stack_000001f8,in_stack_000001f7,in_stack_000001f6);
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator<<(in_RDX,(string *)(in_RDI + 0xa0));
  }
  return;
}

Assistant:

void RollupOutput::Print(const OutputOptions& options, std::ostream* out) {
  if (!source_names_.empty()) {
    switch (options.output_format) {
      case bloaty::OutputFormat::kPrettyPrint:
        PrettyPrint(options, out);
        break;
      case bloaty::OutputFormat::kCSV:
        PrintToCSV(out, /*tabs=*/false, options.showAllSizesCSV);
        break;
      case bloaty::OutputFormat::kTSV:
        PrintToCSV(out, /*tabs=*/true, options.showAllSizesCSV);
        break;
      default:
        BLOATY_UNREACHABLE();
    }
  }

  if (!disassembly_.empty()) {
    *out << disassembly_;
  }
}